

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteVmInstallCollection(unqlite_vm *pVm,unqlite_col *pCol)

{
  sxu32 sVar1;
  uint uVar2;
  unqlite_col **pSrc;
  uint local_3c;
  sxu32 n;
  unqlite_col **apNew;
  unqlite_col *pEntry;
  sxu32 nNewSize;
  sxu32 iBucket;
  SyString *pName;
  unqlite_col *pCol_local;
  unqlite_vm *pVm_local;
  
  sVar1 = SyBinHash((pCol->sName).zString,(pCol->sName).nByte);
  pCol->nHash = sVar1;
  uVar2 = pCol->nHash & pVm->iColSize - 1;
  pCol->pNextCol = pVm->apCol[uVar2];
  if (pVm->apCol[uVar2] != (unqlite_col *)0x0) {
    pVm->apCol[uVar2]->pPrevCol = pCol;
  }
  pVm->apCol[uVar2] = pCol;
  if (pVm->pCol == (unqlite_col *)0x0) {
    pVm->pCol = pCol;
  }
  else {
    pCol->pNext = pVm->pCol;
    pVm->pCol->pPrev = pCol;
    pVm->pCol = pCol;
  }
  pVm->iCol = pVm->iCol + 1;
  if ((pVm->iColSize << 2 <= pVm->iCol) && (pVm->iCol < 10000)) {
    sVar1 = pVm->iColSize;
    pSrc = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc,sVar1 << 4);
    if (pSrc != (unqlite_col **)0x0) {
      SyZero(pSrc,sVar1 << 4);
      local_3c = 0;
      apNew = (unqlite_col **)pVm->pCol;
      for (; local_3c < pVm->iCol; local_3c = local_3c + 1) {
        apNew[0x27] = (unqlite_col *)0x0;
        apNew[0x26] = (unqlite_col *)0x0;
        uVar2 = *(uint *)(apNew + 3) & sVar1 * 2 - 1;
        apNew[0x26] = pSrc[uVar2];
        if (pSrc[uVar2] != (unqlite_col *)0x0) {
          pSrc[uVar2]->pPrevCol = (unqlite_col *)apNew;
        }
        pSrc[uVar2] = (unqlite_col *)apNew;
        apNew = (unqlite_col **)apNew[0x24];
      }
      SyMemBackendFree(&pVm->sAlloc,pVm->apCol);
      pVm->apCol = pSrc;
      pVm->iColSize = sVar1 * 2;
    }
  }
  return 0;
}

Assistant:

static int unqliteVmInstallCollection(
	unqlite_vm *pVm,  /* Target VM */
	unqlite_col *pCol /* Collection to install */
	)
{
	SyString *pName = &pCol->sName;
	sxu32 iBucket;
	/* Hash the collection name */
	pCol->nHash = SyBinHash((const void *)pName->zString,pName->nByte);
	/* Install it in the corresponding bucket */
	iBucket = pCol->nHash & (pVm->iColSize - 1);
	pCol->pNextCol = pVm->apCol[iBucket];
	if( pVm->apCol[iBucket] ){
		pVm->apCol[iBucket]->pPrevCol = pCol;
	}
	pVm->apCol[iBucket] = pCol;
	/* Link to the list of active collections */
	MACRO_LD_PUSH(pVm->pCol,pCol);
	pVm->iCol++;
	if( (pVm->iCol >= pVm->iColSize * 4) && pVm->iCol < 10000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = pVm->iColSize << 1;
		unqlite_col *pEntry;
		unqlite_col **apNew;
		sxu32 n;
		
		apNew = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc, nNewSize * sizeof(unqlite_col *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col *));
			/* Rehash all entries */
			n = 0;
			pEntry = pVm->pCol;
			for(;;){
				/* Loop one */
				if( n >= pVm->iCol ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pVm->sAlloc,(void *)pVm->apCol);
			pVm->apCol = apNew;
			pVm->iColSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}